

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_custom_border_color
          (Impl *this,Value *state,VkSamplerCustomBorderColorCreateInfoEXT **out_info)

{
  VkSamplerCustomBorderColorCreateInfoEXT *pVVar1;
  Type pGVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  uint32_t i;
  long lVar4;
  
  pVVar1 = (VkSamplerCustomBorderColorCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x28,0x10);
  if (pVVar1 != (VkSamplerCustomBorderColorCreateInfoEXT *)0x0) {
    *(undefined8 *)&pVVar1->customBorderColor = 0;
    *(undefined8 *)((long)&pVVar1->customBorderColor + 8) = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    *(undefined8 *)&pVVar1->format = 0;
  }
  *out_info = pVVar1;
  lVar4 = 0;
  do {
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"customBorderColor");
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar2,(SizeType)lVar4);
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) goto LAB_0011e68c;
    *(SizeType *)((long)&pVVar1->customBorderColor + lVar4 * 4) = (pGVar3->data_).s.length;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"format");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->format = (pGVar2->data_).s.length;
    return true;
  }
LAB_0011e68c:
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_sampler_custom_border_color(const Value &state,
							    VkSamplerCustomBorderColorCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerCustomBorderColorCreateInfoEXT>();
	*out_info = info;

	for (uint32_t i = 0; i < 4; i++)
		info->customBorderColor.uint32[i] = state["customBorderColor"][i].GetUint();
	info->format = static_cast<VkFormat>(state["format"].GetUint());

	return true;
}